

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxshift.hpp
# Opt level: O1

void __thiscall soplex::SPxSolverBase<double>::shiftFvec(SPxSolverBase<double> *this)

{
  double *pdVar1;
  pointer pdVar2;
  pointer pdVar3;
  long lVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  Real RVar9;
  Real RVar10;
  double dVar11;
  double dVar12;
  
  dVar6 = entertol(this);
  dVar7 = entertol(this);
  dVar8 = entertol(this);
  RVar9 = Tolerances::epsilon((this->super_SPxLPBase<double>)._tolerances.
                              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr);
  lVar4 = (long)(this->thecovectors->set).thenum;
  if (0 < lVar4) {
    lVar4 = lVar4 + 1;
    do {
      pdVar3 = (this->theUBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      dVar5 = pdVar3[lVar4 + -2];
      dVar12 = (this->theFvec->super_VectorBase<double>).val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[lVar4 + 0xfffffffffffffffe];
      if (dVar12 <= (dVar8 - RVar9) + dVar5) {
        pdVar2 = (this->theLBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        dVar11 = pdVar2[lVar4 + -2];
        if (dVar12 < dVar11 - (dVar8 - RVar9)) {
          if ((dVar5 != dVar11) || (NAN(dVar5) || NAN(dVar11))) {
            RVar10 = Random::next_random(&this->random);
            dVar12 = dVar12 - (RVar10 * dVar7 * 100.0 + (1.0 - RVar10) * dVar6 * 10.0);
            pdVar3 = (this->theLBbound).val.super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            dVar11 = (double)-(ulong)(dVar12 < pdVar3[lVar4 + -2]);
            dVar5 = pdVar3[lVar4 + -2] - dVar12;
            goto LAB_001d5ff4;
          }
          this->theShift =
               (double)((ulong)(dVar11 - dVar12) & -(ulong)(dVar12 < dVar11)) + this->theShift;
          pdVar2[lVar4 + -2] = dVar12;
          pdVar3[lVar4 + -2] = dVar12;
        }
      }
      else {
        pdVar2 = (this->theLBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar1 = pdVar2 + lVar4 + -2;
        if ((dVar5 != *pdVar1) || (NAN(dVar5) || NAN(*pdVar1))) {
          RVar10 = Random::next_random(&this->random);
          dVar12 = dVar12 + RVar10 * dVar7 * 100.0 + (1.0 - RVar10) * dVar6 * 10.0;
          pdVar3 = (this->theUBbound).val.super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          dVar11 = dVar12 - pdVar3[lVar4 + -2];
          dVar5 = (double)-(ulong)(pdVar3[lVar4 + -2] < dVar12);
LAB_001d5ff4:
          this->theShift = (double)((ulong)dVar5 & (ulong)dVar11) + this->theShift;
          pdVar3[lVar4 + -2] = dVar12;
        }
        else {
          this->theShift =
               (double)(-(ulong)(dVar5 < dVar12) & (ulong)(dVar12 - dVar5)) + this->theShift;
          pdVar3[lVar4 + -2] = dVar12;
          pdVar2[lVar4 + -2] = dVar12;
        }
      }
      lVar4 = lVar4 + -1;
    } while (1 < lVar4);
  }
  return;
}

Assistant:

void SPxSolverBase<R>::shiftFvec()
{

   /* the allowed tolerance is (rep() == COLUMN) ? tolerances()->floatingPointFeastol() : tolerances()->floatingPointOpttol() because theFvec is the primal VectorBase<R> in COLUMN
    * and the dual VectorBase<R> in ROW representation; this is equivalent to entertol()
    */
   R minrandom = 10.0 * entertol();
   R maxrandom = 100.0 * entertol();
   R allow = entertol() - epsilon();

   assert(type() == ENTER);
   assert(allow > 0);

   for(int i = dim() - 1; i >= 0; --i)
   {
      if(theUBbound[i] + allow < (*theFvec)[i])
      {
         SPxOut::debug(this, "DSHIFT08 theUBbound[{}] violated by {}", i,
                       (*theFvec)[i] - theUBbound[i] - allow);

         if(theUBbound[i] != theLBbound[i])
         {
            // since minrandom and maxrandom are of the order 10 different,
            // we currently doesn't care about higher precision random
            // numbers. Hence the cast to double.
            shiftUBbound(i, (*theFvec)[i] + random.next((double)minrandom, (double)maxrandom));
         }
         else
         {
            shiftUBbound(i, (*theFvec)[i]);
            theLBbound[i] = theUBbound[i];
         }
      }
      else if((*theFvec)[i] < theLBbound[i] - allow)
      {
         SPxOut::debug(this, "DSHIFT08 theLBbound[{}] violated by {}", i,
                       theLBbound[i] - (*theFvec)[i] - allow);

         if(theUBbound[i] != theLBbound[i])
            shiftLBbound(i, (*theFvec)[i] - random.next((double)minrandom, (double)maxrandom));
         else
         {
            shiftLBbound(i, (*theFvec)[i]);
            theUBbound[i] = theLBbound[i];
         }
      }
   }

#ifndef NDEBUG
   testBounds();
   SPxOut::debug(this, "DSHIFT01 shiftFvec: OK\n");
#endif
}